

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O0

int phr_parse_headers(char *buf_start,size_t len,phr_header *headers,size_t *num_headers,
                     size_t last_len)

{
  char *pcVar1;
  int local_54;
  size_t sStack_50;
  int r;
  size_t max_headers;
  char *buf_end;
  char *buf;
  size_t last_len_local;
  size_t *num_headers_local;
  phr_header *headers_local;
  size_t len_local;
  char *buf_start_local;
  
  max_headers = (size_t)(buf_start + len);
  sStack_50 = *num_headers;
  *num_headers = 0;
  buf_end = buf_start;
  buf = (char *)last_len;
  last_len_local = (size_t)num_headers;
  num_headers_local = (size_t *)headers;
  headers_local = (phr_header *)len;
  len_local = (size_t)buf_start;
  if ((last_len != 0) &&
     (pcVar1 = is_complete(buf_start,(char *)max_headers,last_len,&local_54), pcVar1 == (char *)0x0)
     ) {
    return local_54;
  }
  pcVar1 = parse_headers(buf_end,(char *)max_headers,(phr_header *)num_headers_local,
                         (size_t *)last_len_local,sStack_50,&local_54);
  if (pcVar1 == (char *)0x0) {
    buf_start_local._4_4_ = local_54;
  }
  else {
    buf_start_local._4_4_ = (int)pcVar1 - (int)len_local;
  }
  return buf_start_local._4_4_;
}

Assistant:

int phr_parse_headers(const char *buf_start, size_t len, struct phr_header *headers, size_t *num_headers, size_t last_len)
{
    const char *buf = buf_start, *buf_end = buf + len;
    size_t max_headers = *num_headers;
    int r;

    *num_headers = 0;

    /* if last_len != 0, check if the response is complete (a fast countermeasure
       against slowloris */
    if (last_len != 0 && is_complete(buf, buf_end, last_len, &r) == NULL) {
        return r;
    }

    if ((buf = parse_headers(buf, buf_end, headers, num_headers, max_headers, &r)) == NULL) {
        return r;
    }

    return (int)(buf - buf_start);
}